

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O0

loader_handle mock_loader_impl_load_from_package(loader_impl impl,char *path)

{
  undefined8 in_RSI;
  loader_impl_mock_handle handle;
  undefined8 *local_8;
  
  local_8 = (undefined8 *)malloc(8);
  if (local_8 == (undefined8 *)0x0) {
    local_8 = (undefined8 *)0x0;
  }
  else {
    log_write_impl_va("metacall",0x17b,"mock_loader_impl_load_from_package",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                      ,0,"Mock module %s loaded from package",in_RSI);
    *local_8 = 0;
  }
  return local_8;
}

Assistant:

loader_handle mock_loader_impl_load_from_package(loader_impl impl, const loader_path path)
{
	loader_impl_mock_handle handle = malloc(sizeof(struct loader_impl_mock_handle_type));

	(void)impl;

	if (handle != NULL)
	{
		log_write("metacall", LOG_LEVEL_DEBUG, "Mock module %s loaded from package", path);

		handle->handle_mock_data = NULL;

		return (loader_handle)handle;
	}

	return NULL;
}